

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

QSize __thiscall QHeaderView::sectionSizeFromContents(QHeaderView *this,int logicalIndex)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QIcon QVar4;
  undefined8 uVar5;
  QMetaTypeInterface *pQVar6;
  undefined4 uVar7;
  InterfaceType *pIVar8;
  undefined8 uVar9;
  bool bVar10;
  char cVar11;
  QMetaType QVar12;
  QStyle *pQVar13;
  QSize QVar14;
  anon_union_24_3_e3d07ef4_for_data *lhs;
  anon_union_24_3_e3d07ef4_for_data *paVar15;
  long in_FS_OFFSET;
  QIcon t;
  QPixmap t_1;
  QIcon local_160;
  QIcon local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  QMetaTypeInterface *local_138;
  undefined1 *puStack_130;
  anon_union_24_3_e3d07ef4_for_data local_120;
  QMetaTypeInterface *local_100;
  int local_e0;
  InterfaceType *local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  QIcon local_b8 [2];
  undefined4 local_a4;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  uint uStack_60;
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  uint uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QWidget::ensurePolished((QWidget *)this);
  paVar15 = &local_58;
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
            (paVar15,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),0xd);
  if (3 < CONCAT44(uStack_3c,uStack_40)) {
    local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType;
    local_120.shared = (PrivateShared *)(CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc);
    lhs = &local_120;
    bVar10 = comparesEqual((QMetaType *)&lhs->shared,(QMetaType *)&local_78.shared);
    if (bVar10) {
      if ((uStack_40 & 1) == 0) {
        lhs = &local_58;
      }
      else {
        lhs = (anon_union_24_3_e3d07ef4_for_data *)
              ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
              CONCAT44(local_58._4_4_,local_58._0_4_));
      }
    }
    else {
      local_120._forAlignment = -NAN;
      QVar12.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((uStack_40 & 1) != 0) {
        paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      QMetaType::convert(QVar12,paVar15,(QMetaType)local_78.shared,lhs);
    }
    QVar14 = (QSize)lhs->shared;
    goto LAB_00551029;
  }
  memset(&local_120,0xaa,0x88);
  QStyleOptionHeaderV2::QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)&local_120);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x318))(this,&local_120);
  paVar15 = &local_78;
  local_78._16_4_ = 0xaaaaaaaa;
  local_78._20_4_ = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_4_ = 0xaaaaaaaa;
  local_78._12_4_ = 0xaaaaaaaa;
  local_e0 = logicalIndex;
  (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
            (paVar15,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),6);
  local_138 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_138);
  if (CONCAT44(uStack_5c,uStack_60) < 4) {
LAB_00550b69:
    QFont::operator=((QFont *)&local_138,
                     &((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget.data)->fnt);
  }
  else {
    cVar11 = QMetaType::canConvert
                       ((QMetaTypeInterface *)(CONCAT44(uStack_5c,uStack_60) & 0xfffffffffffffffc),
                        (QMetaType)0x7e7ef0);
    if (cVar11 == '\0') goto LAB_00550b69;
    local_158.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
    local_98.shared = (PrivateShared *)(CONCAT44(uStack_5c,uStack_60) & 0xfffffffffffffffc);
    bVar10 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_158);
    if (bVar10) {
      if ((uStack_60 & 1) == 0) {
        paVar15 = &local_78;
      }
      else {
        paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_78.shared + (int)*(uint *)(local_78.shared + 4));
      }
      QFont::QFont((QFont *)local_98.data,(QFont *)paVar15->data);
    }
    else {
      local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFont::QFont((QFont *)local_98.data);
      QVar12.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((uStack_60 & 1) != 0) {
        paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_78.shared + (int)*(uint *)(local_78.shared + 4));
      }
      QMetaType::convert(QVar12,paVar15,(QMetaType)local_158.d,&local_98);
    }
    pQVar6 = local_138;
    local_138 = (QMetaTypeInterface *)local_98.shared;
    local_98.shared = (PrivateShared *)pQVar6;
    uVar7 = puStack_130._0_4_;
    puStack_130 = (undefined1 *)CONCAT44(puStack_130._4_4_,local_98._8_4_);
    local_98._8_4_ = uVar7;
    QFont::~QFont((QFont *)local_98.data);
  }
  QFont::setWeight((Weight)(QFont *)&local_138);
  QFontMetrics::QFontMetrics((QFontMetrics *)local_98.data,(QFont *)&local_138);
  pQVar6 = local_100;
  local_100 = (QMetaTypeInterface *)local_98.shared;
  local_98.shared = (PrivateShared *)pQVar6;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_98.data);
  (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
            (&local_98,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),0);
  ::QVariant::toString();
  uVar9 = uStack_d0;
  pIVar8 = local_d8;
  uVar5 = local_148;
  QVar4.d = local_158.d;
  local_158.d = (QIconPrivate *)local_d8;
  local_d8 = (InterfaceType *)QVar4.d;
  uStack_d0 = uStack_150;
  uStack_150 = uVar9;
  local_148 = uStack_c8;
  uStack_c8 = uVar5;
  if (pIVar8 != (InterfaceType *)0x0) {
    LOCK();
    *(int *)pIVar8 = *(int *)pIVar8 + -1;
    iVar1._0_2_ = pIVar8->revision;
    iVar1._2_2_ = pIVar8->alignment;
    UNLOCK();
    if (iVar1 == 0) {
      QArrayData::deallocate((QArrayData *)pIVar8,2,0x10);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_98);
  (**(code **)(**(long **)(lVar3 + 0x2f8) + 0xa0))
            (&local_98,*(long **)(lVar3 + 0x2f8),logicalIndex,*(undefined4 *)(lVar3 + 0x548),1);
  paVar15 = &local_58;
  ::QVariant::operator=((QVariant *)paVar15,(QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_98);
  local_98.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
  local_158.d = (QIconPrivate *)(CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc);
  bVar10 = comparesEqual((QMetaType *)&local_158,(QMetaType *)&local_98.shared);
  if (bVar10) {
    if ((uStack_40 & 1) == 0) {
      paVar15 = &local_58;
    }
    else {
      paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                CONCAT44(local_58._4_4_,local_58._0_4_));
    }
    QIcon::QIcon(&local_158,(QIcon *)&paVar15->shared);
  }
  else {
    local_158.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::QIcon(&local_158);
    QVar12.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((uStack_40 & 1) != 0) {
      paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                CONCAT44(local_58._4_4_,local_58._0_4_));
    }
    QMetaType::convert(QVar12,paVar15,(QMetaType)local_98.shared,&local_158);
  }
  local_98.shared = (PrivateShared *)local_b8[0].d;
  local_b8[0].d = local_158.d;
  local_158.d = (QIconPrivate *)0x0;
  QIcon::~QIcon((QIcon *)&local_98.shared);
  QIcon::~QIcon(&local_158);
  cVar11 = QIcon::isNull();
  if (cVar11 != '\0') {
    local_158.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QPixmap>::metaType;
    local_98.shared = (PrivateShared *)(CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc);
    bVar10 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_158);
    if (bVar10) {
      if ((uStack_40 & 1) == 0) {
        paVar15 = &local_58;
      }
      else {
        paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      QPixmap::QPixmap((QPixmap *)local_98.data,(QPixmap *)paVar15->data);
    }
    else {
      local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_98.data);
      paVar15 = &local_58;
      QVar12.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((uStack_40 & 1) != 0) {
        paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
      }
      QMetaType::convert(QVar12,paVar15,(QMetaType)local_158.d,&local_98);
    }
    QIcon::QIcon(&local_160,(QPixmap *)local_98.data);
    local_158.d = local_b8[0].d;
    local_b8[0].d = local_160.d;
    local_160.d = (QIconPrivate *)0x0;
    QIcon::~QIcon(&local_158);
    QIcon::~QIcon(&local_160);
    QPixmap::~QPixmap((QPixmap *)local_98.data);
  }
  if (*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8 + 0x554) == '\x01') {
    local_a4 = 2;
  }
  pQVar13 = QWidget::style((QWidget *)this);
  local_98._forAlignment = -NAN;
  QVar14 = (QSize)(**(code **)(*(long *)pQVar13 + 0xe8))(pQVar13,0x13,&local_120,&local_98,this);
  QFont::~QFont((QFont *)&local_138);
  ::QVariant::~QVariant((QVariant *)&local_78);
  QIcon::~QIcon(local_b8);
  if (local_d8 != (InterfaceType *)0x0) {
    LOCK();
    *(int *)local_d8 = *(int *)local_d8 + -1;
    iVar2._0_2_ = local_d8->revision;
    iVar2._2_2_ = local_d8->alignment;
    UNLOCK();
    if (iVar2 == 0) {
      QArrayData::deallocate((QArrayData *)local_d8,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_120);
LAB_00551029:
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QSize QHeaderView::sectionSizeFromContents(int logicalIndex) const
{
    Q_D(const QHeaderView);
    Q_ASSERT(logicalIndex >= 0);

    ensurePolished();

    // use SizeHintRole
    QVariant variant = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (variant.isValid())
        return qvariant_cast<QSize>(variant);

    // otherwise use the contents
    QStyleOptionHeaderV2 opt;
    initStyleOption(&opt);
    opt.section = logicalIndex;
    QVariant var = d->model->headerData(logicalIndex, d->orientation,
                                            Qt::FontRole);
    QFont fnt;
    if (var.isValid() && var.canConvert<QFont>())
        fnt = qvariant_cast<QFont>(var);
    else
        fnt = font();
    fnt.setBold(true);
    opt.fontMetrics = QFontMetrics(fnt);
    opt.text = d->model->headerData(logicalIndex, d->orientation,
                                    Qt::DisplayRole).toString();
    variant = d->model->headerData(logicalIndex, d->orientation, Qt::DecorationRole);
    opt.icon = qvariant_cast<QIcon>(variant);
    if (opt.icon.isNull())
        opt.icon = qvariant_cast<QPixmap>(variant);
    if (isSortIndicatorShown())
        opt.sortIndicator = QStyleOptionHeader::SortDown;
    return style()->sizeFromContents(QStyle::CT_HeaderSection, &opt, QSize(), this);
}